

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_info.h
# Opt level: O2

void __thiscall
KokkosTools::KernelTimer::KernelPerformanceInfo::writeToBinaryFile
          (KernelPerformanceInfo *this,FILE *output)

{
  ulong uVar1;
  pointer pcVar2;
  void *__ptr;
  uint32_t i;
  long lVar3;
  uint32_t i_1;
  ulong uVar4;
  uint32_t uVar5;
  uint32_t kernelTypeOutput;
  uint32_t recordLen;
  uint32_t kernelNameLen;
  
  uVar1 = (this->kernelName)._M_string_length;
  uVar5 = (uint32_t)uVar1;
  recordLen = uVar5 + 0x20;
  kernelNameLen = uVar5;
  __ptr = malloc((ulong)recordLen);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)__ptr + lVar3) = *(undefined1 *)((long)&kernelNameLen + lVar3);
  }
  pcVar2 = (this->kernelName)._M_dataplus._M_p;
  for (uVar4 = 0; (uVar1 & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
    *(char *)((long)__ptr + uVar4 + 4) = pcVar2[uVar4];
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)__ptr + lVar3 + (ulong)(uVar5 + 4)) =
         *(undefined1 *)((long)&this->callCount + lVar3);
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)__ptr + lVar3 + (ulong)(uVar5 + 0xc)) =
         *(undefined1 *)((long)&this->time + lVar3);
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)__ptr + lVar3 + (ulong)(uVar5 + 0x14)) =
         *(undefined1 *)((long)&this->timeSq + lVar3);
  }
  kernelTypeOutput = this->kType;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)__ptr + lVar3 + (ulong)(uVar5 + 0x1c)) =
         *(undefined1 *)((long)&kernelTypeOutput + lVar3);
  }
  fwrite(&recordLen,4,1,(FILE *)output);
  fwrite(__ptr,(ulong)recordLen,1,(FILE *)output);
  free(__ptr);
  return;
}

Assistant:

void writeToBinaryFile(FILE* output) {
    const uint32_t kernelNameLen = kernelName.size();
    const uint32_t recordLen = sizeof(uint32_t) + sizeof(char) * kernelNameLen +
                               sizeof(uint64_t) + sizeof(double) +
                               sizeof(double) + sizeof(uint32_t);

    uint32_t nextIndex = 0;
    char* entry        = (char*)malloc(recordLen);

    copy(&entry[nextIndex], (char*)&kernelNameLen, sizeof(kernelNameLen));
    nextIndex += sizeof(kernelNameLen);

    copy(&entry[nextIndex], kernelName.c_str(), kernelNameLen);
    nextIndex += kernelNameLen;

    copy(&entry[nextIndex], (char*)&callCount, sizeof(callCount));
    nextIndex += sizeof(callCount);

    copy(&entry[nextIndex], (char*)&time, sizeof(time));
    nextIndex += sizeof(time);

    copy(&entry[nextIndex], (char*)&timeSq, sizeof(timeSq));
    nextIndex += sizeof(timeSq);

    uint32_t kernelTypeOutput = (uint32_t)kType;
    copy(&entry[nextIndex], (char*)&kernelTypeOutput, sizeof(kernelTypeOutput));
    nextIndex += sizeof(kernelTypeOutput);

    fwrite(&recordLen, sizeof(uint32_t), 1, output);
    fwrite(entry, recordLen, 1, output);
    free(entry);
  }